

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

void __thiscall
ProString::ProString<QStringBuilder<char_const(&)[7],QString>,char_const(&)[17]>
          (ProString *this,
          QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]> *str)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>::convertTo<QString>
            ((QString *)&local_30,str);
  ProString(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}